

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O1

bool __thiscall QSqlCachedResult::fetch(QSqlCachedResult *this,int i)

{
  QSqlResultPrivate *pQVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  
  pQVar1 = (this->super_QSqlResult).d_ptr;
  bVar3 = QSqlResult::isActive(&this->super_QSqlResult);
  if (i < 0 || !bVar3) {
LAB_001172ac:
    bVar3 = false;
  }
  else {
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    if (iVar4 == i) {
      return true;
    }
    if (pQVar1->forwardOnly == true) {
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      if ((i < iVar4) || (iVar4 = QSqlResult::at(&this->super_QSqlResult), iVar4 == -2))
      goto LAB_001172ac;
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      if (iVar4 < i + -1) {
        do {
          iVar4 = (*(this->super_QSqlResult)._vptr_QSqlResult[0x1f])(this,pQVar1 + 1,0xffffffff);
          if ((char)iVar4 == '\0') goto LAB_001172ac;
          iVar4 = QSqlResult::at(&this->super_QSqlResult);
          (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,(ulong)(iVar4 + 1));
          iVar4 = QSqlResult::at(&this->super_QSqlResult);
        } while (iVar4 < i + -1);
      }
      iVar4 = (*(this->super_QSqlResult)._vptr_QSqlResult[0x1f])(this,pQVar1 + 1,0);
      if ((char)iVar4 == '\0') {
        return false;
      }
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      i = iVar4 + 1;
    }
    else if (*(int *)&pQVar1[1].sqldriver.wp.value <
             *(int *)((long)&pQVar1[1].sqldriver.wp.value + 4) * (i + 1)) {
      iVar4 = *(int *)&pQVar1[1].sqldriver.wp.value;
      if (0 < iVar4) {
        lVar2 = (long)*(int *)((long)&pQVar1[1].sqldriver.wp.value + 4);
        (*(this->super_QSqlResult)._vptr_QSqlResult[3])
                  (this,(long)iVar4 / lVar2 & 0xffffffff,(long)iVar4 % lVar2 & 0xffffffff);
      }
      do {
        iVar4 = QSqlResult::at(&this->super_QSqlResult);
        if (i < iVar4) goto LAB_001172b9;
        bVar3 = cacheNext(this);
      } while (bVar3);
      if ((pQVar1->forwardOnly != false) ||
         (*(int *)&pQVar1[1].sqldriver.wp.value <
          (i + 1) * *(int *)((long)&pQVar1[1].sqldriver.wp.value + 4))) goto LAB_001172ac;
    }
LAB_001172b9:
    (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,(ulong)(uint)i);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool QSqlCachedResult::fetch(int i)
{
    Q_D(QSqlCachedResult);
    if ((!isActive()) || (i < 0))
        return false;
    if (at() == i)
        return true;
    if (d->forwardOnly) {
        // speed hack - do not copy values if not needed
        if (at() > i || at() == QSql::AfterLastRow)
            return false;
        while(at() < i - 1) {
            if (!gotoNext(d->cache, -1))
                return false;
            setAt(at() + 1);
        }
        if (!gotoNext(d->cache, 0))
            return false;
        setAt(at() + 1);
        return true;
    }
    if (d->canSeek(i)) {
        setAt(i);
        return true;
    }
    if (d->rowCacheEnd > 0)
        setAt(d->cacheCount());
    while (at() < i + 1) {
        if (!cacheNext()) {
            if (d->canSeek(i))
                break;
            return false;
        }
    }
    setAt(i);

    return true;
}